

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void lyxml_correct_elem_ns(ly_ctx *ctx,lyxml_elem *elem,int copy_ns,int correct_attrs)

{
  lyxml_elem *attr_parent;
  lyxml_ns *plVar1;
  lyxml_attr *plVar2;
  lyxml_elem *plVar3;
  lyxml_elem *plVar4;
  
  plVar4 = elem;
  do {
    attr_parent = plVar4;
    plVar4 = attr_parent->parent;
  } while (attr_parent->parent != (lyxml_elem *)0x0);
  plVar4 = elem;
  if (elem != (lyxml_elem *)0x0) {
    do {
      plVar2 = (lyxml_attr *)plVar4->ns;
      if (plVar2 != (lyxml_attr *)0x0 && attr_parent != (lyxml_elem *)0x0) {
        if (copy_ns == 0) {
          plVar2 = (lyxml_attr *)0x0;
        }
        else {
          plVar1 = lyxml_get_ns(plVar4,plVar2->name);
          plVar4->ns = plVar1;
          if (plVar1 != (lyxml_ns *)0x0) goto LAB_00120135;
          plVar2 = lyxml_dup_attr(ctx,plVar4,plVar2);
        }
        plVar4->ns = (lyxml_ns *)plVar2;
      }
LAB_00120135:
      if (correct_attrs != 0) {
        for (plVar2 = plVar4->attr; plVar2 != (lyxml_attr *)0x0; plVar2 = plVar2->next) {
          lyxml_correct_attr_ns(ctx,plVar2,attr_parent,copy_ns);
        }
      }
      plVar3 = plVar4->child;
      if (plVar3 == (lyxml_elem *)0x0) {
        if (plVar4 == elem) {
          return;
        }
        plVar3 = plVar4->next;
      }
      if (plVar3 == (lyxml_elem *)0x0) {
        for (plVar4 = plVar4->parent;
            (plVar4->parent != elem->parent && (plVar3 = plVar4->next, plVar3 == (lyxml_elem *)0x0))
            ; plVar4 = plVar4->parent) {
        }
      }
      plVar4 = plVar3;
    } while (plVar3 != (lyxml_elem *)0x0);
  }
  return;
}

Assistant:

void
lyxml_correct_elem_ns(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns, int correct_attrs)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *elem_root, *ns_root, *tmp, *iter;
    struct lyxml_attr *attr;

    /* find the root of elem */
    for (elem_root = elem; elem_root->parent; elem_root = elem_root->parent);

    LY_TREE_DFS_BEGIN(elem, tmp, iter) {
        if (iter->ns) {
            /* find the root of elem NS */
            for (ns_root = iter->ns->parent; ns_root; ns_root = ns_root->parent);

            /* elem NS is defined outside elem subtree */
            if (ns_root != elem_root) {
                if (copy_ns) {
                    tmp_ns = iter->ns;
                    /* we may have already copied the NS over? */
                    iter->ns = lyxml_get_ns(iter, tmp_ns->prefix);

                    /* we haven't copied it over, copy it now */
                    if (!iter->ns) {
                        iter->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, iter, (struct lyxml_attr *)tmp_ns);
                    }
                } else {
                    iter->ns = NULL;
                }
            }
        }
        if (correct_attrs) {
            LY_TREE_FOR(iter->attr, attr) {
                lyxml_correct_attr_ns(ctx, attr, elem_root, copy_ns);
            }
        }
        LY_TREE_DFS_END(elem, tmp, iter);
    }
}